

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

string * __thiscall
ArgsManager::GetHelpMessage_abi_cxx11_(string *__return_storage_ptr__,ArgsManager *this)

{
  bool bVar1;
  _Rb_tree_color _Var2;
  _Rb_tree_node_base *p_Var3;
  _Base_ptr p_Var4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock19;
  string name;
  allocator<char> local_89;
  unique_lock<std::recursive_mutex> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"-help-debug",(allocator<char> *)&local_78);
  bVar1 = GetBoolArg(this,&local_58,false);
  std::__cxx11::string::~string((string *)&local_58);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_88,&this->cs_args,"cs_args"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/args.cpp"
             ,0x266,false);
  for (p_Var4 = (this->m_available_args)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->m_available_args)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    _Var2 = p_Var4[1]._M_color;
    switch(_Var2) {
    case _S_red:
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"Options:",&local_89);
      HelpMessageGroup(&local_58,&local_78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_58);
      break;
    case _S_black:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"Connection options:",&local_89);
      HelpMessageGroup(&local_58,&local_78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_58);
      break;
    case 2:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"Wallet options:",&local_89);
      HelpMessageGroup(&local_58,&local_78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_58);
      break;
    case 3:
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"Wallet debugging/testing options:",&local_89);
        HelpMessageGroup(&local_58,&local_78);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,&local_58);
        break;
      }
      goto LAB_0011688e;
    case 4:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"ZeroMQ notification options:",&local_89);
      HelpMessageGroup(&local_58,&local_78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_58);
      break;
    case 5:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"Debugging/Testing options:",&local_89);
      HelpMessageGroup(&local_58,&local_78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_58);
      break;
    case 6:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"Chain selection options:",&local_89);
      HelpMessageGroup(&local_58,&local_78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_58);
      break;
    case 7:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"Node relay options:",&local_89);
      HelpMessageGroup(&local_58,&local_78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_58);
      break;
    case 8:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"Block creation options:",&local_89);
      HelpMessageGroup(&local_58,&local_78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_58);
      break;
    case 9:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"RPC server options:",&local_89);
      HelpMessageGroup(&local_58,&local_78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_58);
      break;
    case 10:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"UI Options:",&local_89);
      HelpMessageGroup(&local_58,&local_78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_58);
      break;
    case 0xb:
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"Commands:",&local_89);
      HelpMessageGroup(&local_58,&local_78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_58);
      break;
    case 0xc:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"Register Commands:",&local_89);
      HelpMessageGroup(&local_58,&local_78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_58);
      break;
    case 0xd:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"CLI Commands:",&local_89);
      HelpMessageGroup(&local_58,&local_78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_58);
      break;
    case 0xe:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"IPC interprocess connection options:",&local_89);
      HelpMessageGroup(&local_58,&local_78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_58);
      break;
    default:
      goto switchD_001165af_default;
    }
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    _Var2 = p_Var4[1]._M_color;
switchD_001165af_default:
    if (_Var2 == 0xf) break;
LAB_0011688e:
    for (p_Var3 = *(_Rb_tree_node_base **)(p_Var4 + 2);
        p_Var3 != (_Rb_tree_node_base *)&p_Var4[1]._M_left;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      if ((bVar1) || ((p_Var3[4]._M_color & 0x100) == _S_red)) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        local_58._M_string_length = 0;
        local_58.field_2._M_local_buf[0] = '\0';
        if (p_Var3[2]._M_parent == (_Base_ptr)0x0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&local_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var3 + 1));
        }
        else {
          std::operator+(&local_78,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var3 + 1),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var3 + 2));
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_58,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
        }
        HelpMessageOpt(&local_78,&local_58,(string *)(p_Var3 + 3));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_58);
      }
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ArgsManager::GetHelpMessage() const
{
    const bool show_debug = GetBoolArg("-help-debug", false);

    std::string usage;
    LOCK(cs_args);
    for (const auto& arg_map : m_available_args) {
        switch(arg_map.first) {
            case OptionsCategory::OPTIONS:
                usage += HelpMessageGroup("Options:");
                break;
            case OptionsCategory::CONNECTION:
                usage += HelpMessageGroup("Connection options:");
                break;
            case OptionsCategory::ZMQ:
                usage += HelpMessageGroup("ZeroMQ notification options:");
                break;
            case OptionsCategory::DEBUG_TEST:
                usage += HelpMessageGroup("Debugging/Testing options:");
                break;
            case OptionsCategory::NODE_RELAY:
                usage += HelpMessageGroup("Node relay options:");
                break;
            case OptionsCategory::BLOCK_CREATION:
                usage += HelpMessageGroup("Block creation options:");
                break;
            case OptionsCategory::RPC:
                usage += HelpMessageGroup("RPC server options:");
                break;
            case OptionsCategory::IPC:
                usage += HelpMessageGroup("IPC interprocess connection options:");
                break;
            case OptionsCategory::WALLET:
                usage += HelpMessageGroup("Wallet options:");
                break;
            case OptionsCategory::WALLET_DEBUG_TEST:
                if (show_debug) usage += HelpMessageGroup("Wallet debugging/testing options:");
                break;
            case OptionsCategory::CHAINPARAMS:
                usage += HelpMessageGroup("Chain selection options:");
                break;
            case OptionsCategory::GUI:
                usage += HelpMessageGroup("UI Options:");
                break;
            case OptionsCategory::COMMANDS:
                usage += HelpMessageGroup("Commands:");
                break;
            case OptionsCategory::REGISTER_COMMANDS:
                usage += HelpMessageGroup("Register Commands:");
                break;
            case OptionsCategory::CLI_COMMANDS:
                usage += HelpMessageGroup("CLI Commands:");
                break;
            default:
                break;
        }

        // When we get to the hidden options, stop
        if (arg_map.first == OptionsCategory::HIDDEN) break;

        for (const auto& arg : arg_map.second) {
            if (show_debug || !(arg.second.m_flags & ArgsManager::DEBUG_ONLY)) {
                std::string name;
                if (arg.second.m_help_param.empty()) {
                    name = arg.first;
                } else {
                    name = arg.first + arg.second.m_help_param;
                }
                usage += HelpMessageOpt(name, arg.second.m_help_text);
            }
        }
    }
    return usage;
}